

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.hpp
# Opt level: O1

void __thiscall
InstructionSet::x86::Instruction<true>::Instruction
          (Instruction<true> *this,Operation operation,Source source,Source destination,
          ScaleIndexBase sib,bool lock,AddressSize address_size,Source segment_override,
          DataSize data_size,DisplacementT displacement,ImmediateT operand)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  Source SVar5;
  undefined7 in_register_00000009;
  ushort uVar6;
  undefined7 in_register_00000011;
  bool bVar7;
  
  _data_size = (uint)data_size;
  this->operation_ = operation;
  SVar5 = C0;
  if ((int)CONCAT71(in_register_00000011,source) == 0x18) {
    SVar5 = sib.sib_ & BH;
  }
  SVar5 = SVar5 | (operand != 0) << 5 | (displacement != 0) << 6 | address_size << 7 | source;
  this->mem_exts_source_ = SVar5;
  uVar3 = (uint)CONCAT71(in_register_00000009,destination);
  uVar4 = (uint)(sib.sib_ & BH);
  if (uVar3 != 0x18) {
    uVar4 = 0;
  }
  uVar4 = uVar4 | ((uint)lock << 0xd | _data_size << 0xe) + (sib.sib_ & 0xf8) * 4 | uVar3;
  uVar2 = (ushort)uVar4;
  this->source_data_dest_sib_ = uVar2;
  this->extensions_[0] = 0;
  this->extensions_[1] = 0;
  bVar7 = (SVar5 & 0x20) != C0;
  if (bVar7) {
    this->extensions_[0] = operand;
  }
  if ((SVar5 & 0x40) != C0) {
    this->extensions_[bVar7] = displacement;
  }
  if ((segment_override == None) &&
     (segment_override = None, ("\x1f\x1f\x1f\x18"[SVar5 >> 3 & 3] & SVar5) == Indirect)) {
    segment_override = (Source)(0x80b0a0a0b0b0b0b >> ((SVar5 & BH) << 3));
  }
  if ((segment_override == None) &&
     (bVar1 = (byte)uVar4, segment_override = None,
     ("\x1f\x1f\x1f\x18"[(uVar3 & 0x18) >> 3] & bVar1) == 0x18)) {
    segment_override = (Source)(0x80b0a0a0b0b0b0b >> (bVar1 * '\b' & 0x3f));
  }
  uVar6 = 3;
  if (segment_override != None) {
    uVar6 = (ushort)(segment_override & BH);
  }
  this->source_data_dest_sib_ = uVar2 | uVar6 << 10;
  return;
}

Assistant:

constexpr Instruction(
			Operation operation,
			Source source,
			Source destination,
			ScaleIndexBase sib,
			bool lock,
			AddressSize address_size,
			Source segment_override,
			DataSize data_size,
			DisplacementT displacement,
			ImmediateT operand) noexcept :
				operation_(operation),
				mem_exts_source_(uint8_t(
					(int(address_size) << 7) |
					(displacement ? 0x40 : 0x00) |
					(operand ? 0x20 : 0x00) |
					int(source) |
					(source == Source::Indirect ? (uint8_t(sib) & 7) : 0)
				)),
				source_data_dest_sib_(uint16_t(
					(int(data_size) << 14) |
					(lock ? (1 << 13) : 0) |
					((uint8_t(sib) & 0xf8) << 2) |
					int(destination) |
					(destination == Source::Indirect ? (uint8_t(sib) & 7) : 0)
				)) {
			// Decisions on whether to include operand, displacement and/or size extension words
			// have implicitly been made in the int packing above; honour them here.
			int extension = 0;
			if(has_operand()) {
				extensions_[extension] = operand;
				++extension;
			}
			if(has_displacement()) {
				extensions_[extension] = ImmediateT(displacement);
				++extension;
			}

			// Patch in a fully-resolved segment.
			Source segment = segment_override;
			if(segment == Source::None) segment = this->source().default_segment();
			if(segment == Source::None) segment = this->destination().default_segment();
			if(segment == Source::None) segment = Source::DS;
			source_data_dest_sib_ |= (int(segment)&7) << 10;
		}